

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O1

string * __thiscall
cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::extract_single_value
          (string *__return_storage_ptr__,
          cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *this,string *input,ParseMode *parseState)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  
  uVar1 = input->_M_string_length;
  uVar2 = (this->Name)._M_string_length;
  if (uVar1 < uVar2) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar2,
               uVar1);
  }
  pcVar4 = (input->_M_dataplus)._M_p + uVar2;
  lVar3 = uVar1 - uVar2;
  if (lVar3 != 0) {
    if (*pcVar4 != '=') goto LAB_0015c5d2;
    pcVar4 = pcVar4 + 1;
    lVar3 = lVar3 + -1;
    if (lVar3 != 0) goto LAB_0015c5d2;
  }
  *parseState = ValueError;
LAB_0015c5d2:
  if ((*parseState == Valid) && (*pcVar4 == ' ')) {
    pcVar4 = pcVar4 + 1;
    lVar3 = lVar3 + -1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar4,pcVar4 + lVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string extract_single_value(std::string const& input,
                                   ParseMode& parseState) const
  {
    // parse the string to get the value
    auto possible_value = cm::string_view(input).substr(this->Name.size());
    if (possible_value.empty()) {
      parseState = ParseMode::ValueError;
    } else if (possible_value[0] == '=') {
      possible_value.remove_prefix(1);
      if (possible_value.empty()) {
        parseState = ParseMode::ValueError;
      }
    }
    if (parseState == ParseMode::Valid && possible_value[0] == ' ') {
      possible_value.remove_prefix(1);
    }
    return std::string(possible_value);
  }